

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::
MaybeAlive<Lib::Stack<std::unique_ptr<Lib::Stack<Kernel::TermList_*>,_std::default_delete<Lib::Stack<Kernel::TermList_*>_>_>_>_>
::~MaybeAlive(MaybeAlive<Lib::Stack<std::unique_ptr<Lib::Stack<Kernel::TermList_*>,_std::default_delete<Lib::Stack<Kernel::TermList_*>_>_>_>_>
              *this)

{
  ulong uVar1;
  default_delete<Lib::Stack<Kernel::TermList_*>_> *pdVar2;
  pointer *__ptr;
  default_delete<Lib::Stack<Kernel::TermList_*>_> *this_00;
  
  *this->_alive = false;
  pdVar2 = (default_delete<Lib::Stack<Kernel::TermList_*>_> *)(this->_self)._stack;
  this_00 = (default_delete<Lib::Stack<Kernel::TermList_*>_> *)(this->_self)._cursor;
  if (this_00 != pdVar2) {
    do {
      this_00 = this_00 + -8;
      if (*(Stack<Kernel::TermList_*> **)this_00 != (Stack<Kernel::TermList_*> *)0x0) {
        std::default_delete<Lib::Stack<Kernel::TermList_*>_>::operator()
                  (this_00,*(Stack<Kernel::TermList_*> **)this_00);
      }
      *(undefined8 *)this_00 = 0;
      pdVar2 = (default_delete<Lib::Stack<Kernel::TermList_*>_> *)(this->_self)._stack;
    } while (this_00 != pdVar2);
  }
  if (pdVar2 != (default_delete<Lib::Stack<Kernel::TermList_*>_> *)0x0) {
    uVar1 = (this->_self)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pdVar2;
    }
    else if (uVar1 < 0x11) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pdVar2;
    }
    else if (uVar1 < 0x19) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pdVar2;
    }
    else if (uVar1 < 0x21) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pdVar2;
    }
    else if (uVar1 < 0x31) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pdVar2;
    }
    else {
      if (0x40 < uVar1) {
        operator_delete(pdVar2,0x10);
        return;
      }
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pdVar2;
    }
  }
  return;
}

Assistant:

~MaybeAlive() { *_alive = false; }